

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O2

void __thiscall raspicam::_private::Private_Impl::setFormat(Private_Impl *this,RASPICAM_FORMAT fmt)

{
  ostream *poVar1;
  
  if (this->_isOpened == true) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rmsalinas[P]raspicam/src/private/private_impl.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x21c);
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = std::operator<<(poVar1,"setFormat");
    poVar1 = std::operator<<(poVar1,": can not change format with camera already opened");
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  (this->State).captureFtm = fmt;
  return;
}

Assistant:

void Private_Impl::setFormat ( RASPICAM_FORMAT fmt ) {
            if ( isOpened() ) {
                cerr<<__FILE__<<":"<<__LINE__<<":"<<__func__<<": can not change format with camera already opened"<<endl;
                return;
            }
            State.captureFtm = fmt;
        }